

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O0

double __thiscall ON_SubDMatrix::TestMatrix(ON_SubDMatrix *this)

{
  double *E2_00;
  double *LP_00;
  double *L1_00;
  double *L2_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  double *E1_00;
  ulong LP_capacity;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ON_SubDMatrix *local_1c0;
  double local_1a0;
  double local_188;
  double z;
  double dStack_128;
  uint j_1;
  double y2;
  double y1;
  double dStack_110;
  uint j;
  double x2;
  double x1;
  double *Si;
  double dStack_f0;
  uint i_2;
  double E2oLP;
  double E1oLP;
  double L2sum;
  double L1sum;
  double LPsum;
  double dStack_c0;
  uint i_1;
  double lengthL2;
  double lengthL1;
  double lengthE2;
  double lengthE1;
  uint local_98;
  bool bSmoothOrDartTwoFaceCase;
  bool bDartTwoFaceCase;
  bool bSmoothTwoFaceCase;
  uint i;
  double d;
  double *L2;
  double *L1;
  double *LP;
  double *E2;
  double *E1;
  ON_SimpleArray<double> buffer;
  ON_SubDMatrix *pOStack_30;
  bool bTestLimitEvaluation;
  double rc;
  uint lambda_multiplicity;
  double lambda;
  ON_SubDMatrix *this_local;
  
  if ((this->m_S == (double **)0x0) || (this->m_R < 3)) {
    ON_SubDIncrementErrorCount();
    return -1.23432101234321e+308;
  }
  bVar1 = ON_SubDSectorType::IsValid(&this->m_sector_type);
  if (!bVar1) {
    ON_SubDIncrementErrorCount();
    return -1.23432101234321e+308;
  }
  uVar5 = this->m_R;
  uVar4 = ON_SubDSectorType::PointRingCount(&this->m_sector_type);
  if (uVar5 != uVar4) {
    ON_SubDIncrementErrorCount();
    return -1.23432101234321e+308;
  }
  dVar6 = ON_SubDSectorType::SubdominantEigenvalue(&this->m_sector_type);
  if ((dVar6 <= 0.0) || (1.0 <= dVar6)) {
    ON_SubDIncrementErrorCount();
    return -1.23432101234321e+308;
  }
  uVar5 = ON_SubDSectorType::SubdominantEigenvalueMulitiplicity(&this->m_sector_type);
  if (uVar5 == 0) {
    ON_SubDIncrementErrorCount();
    return -1.23432101234321e+308;
  }
  pOStack_30 = (ON_SubDMatrix *)0x0;
  buffer.m_capacity._3_1_ =
       ON_SubDSectorType::SurfaceEvaluationCoefficientsAvailable(&this->m_sector_type);
  ON_SimpleArray<double>::ON_SimpleArray((ON_SimpleArray<double> *)&E1);
  E1_00 = ON_SimpleArray<double>::Reserve((ON_SimpleArray<double> *)&E1,(ulong)(this->m_R * 5));
  E2_00 = E1_00 + this->m_R;
  LP_00 = E2_00 + this->m_R;
  L1_00 = LP_00 + this->m_R;
  L2_00 = L1_00 + this->m_R;
  dVar7 = ON_SubDSectorType::GetSubdominantEigenvectors
                    (&this->m_sector_type,E1_00,(ulong)this->m_R,E2_00,(ulong)this->m_R);
  if ((dVar7 != dVar6) || (NAN(dVar7) || NAN(dVar6))) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
    goto LAB_0090dd11;
  }
  if ((buffer.m_capacity._3_1_ & 1) == 0) {
    for (local_98 = 0; local_98 < this->m_R; local_98 = local_98 + 1) {
      LP_00[local_98] = 0.0;
      L1_00[local_98] = 0.0;
      L2_00[local_98] = 0.0;
    }
  }
  else {
    LP_capacity = (ulong)this->m_R;
    uVar4 = ON_SubDSectorType::GetSurfaceEvaluationCoefficients
                      (&this->m_sector_type,LP_00,LP_capacity,L1_00,LP_capacity,L2_00,LP_capacity);
    if (uVar4 == 0) {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
      goto LAB_0090dd11;
    }
  }
  bVar1 = ON_SubDSectorType::IsSmoothSector(&this->m_sector_type);
  if (bVar1) {
LAB_0090cfdb:
    uVar4 = ON_SubDSectorType::FaceCount(&this->m_sector_type);
    bVar1 = false;
    if (uVar4 == 2) {
      uVar4 = ON_SubDSectorType::EdgeCount(&this->m_sector_type);
      bVar1 = uVar4 == 2;
    }
  }
  else {
    bVar2 = ON_SubDSectorType::IsDartSector(&this->m_sector_type);
    bVar1 = false;
    if (bVar2) goto LAB_0090cfdb;
  }
  bVar2 = ON_SubDSectorType::IsSmoothSector(&this->m_sector_type);
  if (bVar2) {
LAB_0090d087:
    uVar4 = ON_SubDSectorType::FaceCount(&this->m_sector_type);
    bVar2 = false;
    if (uVar4 == 2) {
      uVar4 = ON_SubDSectorType::EdgeCount(&this->m_sector_type);
      bVar2 = uVar4 == 2;
    }
  }
  else {
    bVar3 = ON_SubDSectorType::IsDartSector(&this->m_sector_type);
    bVar2 = false;
    if (bVar3) goto LAB_0090d087;
  }
  bVar3 = true;
  if (!bVar1) {
    bVar3 = bVar2;
  }
  lengthE2 = 0.0;
  lengthL1 = 0.0;
  lengthL2 = 0.0;
  dStack_c0 = 0.0;
  for (LPsum._4_4_ = 0; LPsum._4_4_ < this->m_R; LPsum._4_4_ = LPsum._4_4_ + 1) {
    lengthE2 = E1_00[LPsum._4_4_] * E1_00[LPsum._4_4_] + lengthE2;
    lengthL1 = E2_00[LPsum._4_4_] * E2_00[LPsum._4_4_] + lengthL1;
    lengthL2 = L1_00[LPsum._4_4_] * L1_00[LPsum._4_4_] + lengthL2;
    dStack_c0 = L2_00[LPsum._4_4_] * L2_00[LPsum._4_4_] + dStack_c0;
  }
  if ((bVar3) || (0.0 < lengthE2)) {
    if (0.0 < lengthL1) {
      if (0.0 < lengthL2) {
        if (0.0 < dStack_c0) {
          dVar7 = sqrt(lengthE2);
          dVar8 = sqrt(lengthL1);
          dVar9 = sqrt(lengthL2);
          dVar10 = sqrt(dStack_c0);
          if ((bVar3) || (0.0 < dVar7)) {
            if (0.0 < dVar8) {
              if (0.0 < dVar9) {
                if (0.0 < dVar10) {
                  L1sum = 0.0;
                  L2sum = 0.0;
                  E1oLP = 0.0;
                  E2oLP = 0.0;
                  dStack_f0 = 0.0;
                  for (Si._4_4_ = 0; Si._4_4_ < this->m_R; Si._4_4_ = Si._4_4_ + 1) {
                    if (LP_00[Si._4_4_] < 0.0) {
                      ON_SubDIncrementErrorCount();
                      this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                      goto LAB_0090dd11;
                    }
                    x2 = 0.0;
                    dStack_110 = 0.0;
                    for (y1._4_4_ = 0; y1._4_4_ < this->m_R; y1._4_4_ = y1._4_4_ + 1) {
                      x2 = this->m_S[Si._4_4_][y1._4_4_] * E1_00[y1._4_4_] + x2;
                      dStack_110 = this->m_S[Si._4_4_][y1._4_4_] * E2_00[y1._4_4_] + dStack_110;
                    }
                    if (bVar3) {
                      local_188 = 0.0;
                    }
                    else {
                      local_188 = ABS((-dVar6 * E1_00[Si._4_4_] + x2) / dVar7);
                    }
                    pOStack_30 = (ON_SubDMatrix *)
                                 TestMatrixReturnValue(local_188,(double)pOStack_30);
                    if (((double)pOStack_30 < 0.0) ||
                       ((uVar5 == 2 &&
                        (pOStack_30 = (ON_SubDMatrix *)
                                      TestMatrixReturnValue
                                                (ABS((dStack_110 - dVar6 * E2_00[Si._4_4_]) / dVar8)
                                                 ,(double)pOStack_30), (double)pOStack_30 < 0.0))))
                    break;
                    if ((buffer.m_capacity._3_1_ & 1) != 0) {
                      if ((this->m_LP != (double *)0x0) &&
                         ((this->m_LP[Si._4_4_] != LP_00[Si._4_4_] ||
                          (NAN(this->m_LP[Si._4_4_]) || NAN(LP_00[Si._4_4_]))))) {
                        ON_SubDIncrementErrorCount();
                        this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                        goto LAB_0090dd11;
                      }
                      y2 = 0.0;
                      dStack_128 = 0.0;
                      for (z._4_4_ = 0; z._4_4_ < this->m_R; z._4_4_ = z._4_4_ + 1) {
                        y2 = this->m_S[z._4_4_][Si._4_4_] * L1_00[z._4_4_] + y2;
                        dStack_128 = this->m_S[z._4_4_][Si._4_4_] * L2_00[z._4_4_] + dStack_128;
                      }
                      if ((bVar2) && ((Si._4_4_ == 2 || (Si._4_4_ == 4)))) {
                        local_1a0 = 0.0;
                      }
                      else {
                        local_1a0 = ABS((-dVar6 * L1_00[Si._4_4_] + y2) / dVar9);
                      }
                      pOStack_30 = (ON_SubDMatrix *)
                                   TestMatrixReturnValue(local_1a0,(double)pOStack_30);
                      if (((double)pOStack_30 < 0.0) ||
                         ((uVar5 == 2 &&
                          (pOStack_30 = (ON_SubDMatrix *)
                                        TestMatrixReturnValue
                                                  (ABS((dStack_128 - dVar6 * L2_00[Si._4_4_]) /
                                                       dVar10),(double)pOStack_30),
                          (double)pOStack_30 < 0.0)))) break;
                      L1sum = LP_00[Si._4_4_] + L1sum;
                      L2sum = L1_00[Si._4_4_] + L2sum;
                      E1oLP = L2_00[Si._4_4_] + E1oLP;
                      E2oLP = E1_00[Si._4_4_] * LP_00[Si._4_4_] + E2oLP;
                      dStack_f0 = E2_00[Si._4_4_] * LP_00[Si._4_4_] + dStack_f0;
                    }
                  }
                  if ((buffer.m_capacity._3_1_ & 1) != 0) {
                    if ((0.0 <= (double)pOStack_30) &&
                       (pOStack_30 = (ON_SubDMatrix *)
                                     TestMatrixReturnValue(ABS(1.0 - L1sum),(double)pOStack_30),
                       0.0 <= (double)pOStack_30)) {
                      if (bVar3) {
                        local_1c0 = (ON_SubDMatrix *)0x0;
                      }
                      else {
                        local_1c0 = (ON_SubDMatrix *)
                                    TestMatrixReturnValue(ABS(E2oLP) / dVar7,(double)pOStack_30);
                      }
                      pOStack_30 = local_1c0;
                      if (((0.0 <= (double)local_1c0) &&
                          (pOStack_30 = (ON_SubDMatrix *)
                                        TestMatrixReturnValue
                                                  (ABS(dStack_f0) / dVar8,(double)local_1c0),
                          0.0 <= (double)pOStack_30)) &&
                         (pOStack_30 = (ON_SubDMatrix *)
                                       TestMatrixReturnValue(ABS(L2sum) / dVar9,(double)pOStack_30),
                         0.0 <= (double)pOStack_30)) {
                        pOStack_30 = (ON_SubDMatrix *)
                                     TestMatrixReturnValue(ABS(E1oLP) / dVar10,(double)pOStack_30);
                      }
                    }
                    dVar6 = ON_SubDSectorType::SurfaceNormalSign(&this->m_sector_type);
                    if (dVar6 <= 0.0) {
                      ON_SubDIncrementErrorCount();
                      this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                      goto LAB_0090dd11;
                    }
                  }
                  if ((double)pOStack_30 < 0.0) {
                    ON_SubDIncrementErrorCount();
                    this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                  }
                  else {
                    this_local = pOStack_30;
                  }
                }
                else {
                  ON_SubDIncrementErrorCount();
                  this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
                }
              }
              else {
                ON_SubDIncrementErrorCount();
                this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
              }
            }
            else {
              ON_SubDIncrementErrorCount();
              this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
            }
          }
          else {
            ON_SubDIncrementErrorCount();
            this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
          }
        }
        else {
          ON_SubDIncrementErrorCount();
          this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
        }
      }
      else {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubDMatrix *)0xffe5f8bd9e331dd2;
  }
LAB_0090dd11:
  ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)&E1);
  return (double)this_local;
}

Assistant:

double ON_SubDMatrix::TestMatrix() const
{
  if (nullptr == m_S || m_R < 3)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if ( false == m_sector_type.IsValid() )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if (m_R != m_sector_type.PointRingCount())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const double lambda = m_sector_type.SubdominantEigenvalue();
  if (!(lambda > 0.0 && lambda < 1.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int lambda_multiplicity = m_sector_type.SubdominantEigenvalueMulitiplicity();
  if ( lambda_multiplicity <= 0 )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  double rc = 0.0;


  const bool bTestLimitEvaluation = m_sector_type.SurfaceEvaluationCoefficientsAvailable();

  // Eigen information test
  ON_SimpleArray<double> buffer;
  double* E1 = buffer.Reserve(5*m_R);
  double* E2 = E1 + m_R;
  double* LP = E2 + m_R;
  double* L1 = LP + m_R;
  double* L2 = L1 + m_R;
  double d = m_sector_type.GetSubdominantEigenvectors(E1, m_R, E2, m_R);
  if (!(d == lambda))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if (bTestLimitEvaluation)
  {
    if (!m_sector_type.GetSurfaceEvaluationCoefficients(LP, m_R, L1, m_R, L2, m_R))
      return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  }
  else
  {
    for (unsigned int i = 0; i < m_R; i++)
    {
      LP[i] = 0.0;
      L1[i] = 0.0;
      L2[i] = 0.0;
    }
  }

  // A smooth sector with 2 faces is degenerate and does not have nice eigenvalues and eigenvectors
  // that give a well defined surface normal. In this case we use a heuristic for the normal.
  // When bSmoothTwoFaceCase E1 = {0,0,0,0,0}, lengthE1 = 0, lengthE1 = 0.
  const bool bSmoothTwoFaceCase
    = (m_sector_type.IsSmoothSector() || m_sector_type.IsDartSector())
    && 2u == m_sector_type.FaceCount()
    && 2u == m_sector_type.EdgeCount()
    ;
  const bool bDartTwoFaceCase
    = (m_sector_type.IsSmoothSector() || m_sector_type.IsDartSector())
    && 2u == m_sector_type.FaceCount()
    && 2u == m_sector_type.EdgeCount()
    ;
  const bool bSmoothOrDartTwoFaceCase = bSmoothTwoFaceCase || bDartTwoFaceCase;

  double lengthE1 = 0.0;
  double lengthE2 = 0.0;
  double lengthL1 = 0.0;
  double lengthL2 = 0.0;
  for (unsigned int i = 0; i < m_R; i++)
  {
    lengthE1 += E1[i] * E1[i];
    lengthE2 += E2[i] * E2[i];
    lengthL1 += L1[i] * L1[i];
    lengthL2 += L2[i] * L2[i];
  }
  if (false == bSmoothOrDartTwoFaceCase && !(lengthE1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthE2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  lengthE1 = sqrt(lengthE1);
  lengthE2 = sqrt(lengthE2);
  lengthL1 = sqrt(lengthL1);
  lengthL2 = sqrt(lengthL2);
  if (false == bSmoothOrDartTwoFaceCase && !(lengthE1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthE2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  
  double LPsum = 0.0;
  double L1sum = 0.0;
  double L2sum = 0.0;
  double E1oLP = 0.0;
  double E2oLP = 0.0;
  for (unsigned int i = 0; i < m_R; i++)
  {
    if (!(LP[i] >= 0.0))
      return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

    const double* Si = m_S[i];
    double x1 = 0.0;
    double x2 = 0.0;
    for (unsigned int j = 0; j < m_R; j++)
    {
      // E1, E2 should be eigenvectors of S with eigenvalue lambda
      x1 += Si[j] * E1[j];
      x2 += Si[j] * E2[j];
    }
    d = bSmoothOrDartTwoFaceCase ? 0.0 : fabs((x1 - lambda*E1[i])/lengthE1);
    rc = TestMatrixReturnValue(d,rc);
    if (!(rc >= 0.0))
      break;

    if (2 == lambda_multiplicity)
    {
      d = fabs((x2 - lambda*E2[i])/lengthE2);
      rc = TestMatrixReturnValue(d, rc);
      if (!(rc >= 0.0))
        break;
    }

    if ( false == bTestLimitEvaluation )
      continue;

    if (nullptr != m_LP)
    {
      if ( !(m_LP[i] == LP[i]) )
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
    }

    double y1 = 0.0;
    double y2 = 0.0;
    for (unsigned int j = 0; j < m_R; j++)
    {
      // L1, L2 should be eigenvectors of Transpose(S) with eigenvalue lambda
      y1 += m_S[j][i] * L1[j];
      y2 += m_S[j][i] * L2[j];
    }

    d = (bDartTwoFaceCase && (2u == i || 4u == i)) ? 0.0 : fabs((y1 - lambda*L1[i])/lengthL1);
    rc = TestMatrixReturnValue(d,rc);
    if (!(rc >= 0.0))
      break;

    if (2 == lambda_multiplicity)
    {
      d = fabs((y2 - lambda*L2[i])/lengthL2);
      rc = TestMatrixReturnValue(d, rc);
      if (!(rc >= 0.0))
        break;
    }


    LPsum += LP[i];
    L1sum += L1[i];
    L2sum += L2[i];

    E1oLP += E1[i] * LP[i];
    E2oLP += E2[i] * LP[i];
  }
    
  if (bTestLimitEvaluation)
  {
    while (rc >= 0.0)
    {
      // LP coefficients should sum to 1
      rc = TestMatrixReturnValue(fabs(1.0 - LPsum), rc);
      if (!(rc >= 0.0))
        break;

      // E1 and E2 should be orthogonal to LP which means
      // E0oLP and E1oLP should be zero
      //
      // Why?
      //   Set T = Transpose(S).
      //   T*LP = LP (LP is an eigenvector or T with eigenvalue = 1)
      //   S*E = lambda*E (E is an eigenvector of S with eigenvalue lambda != 1)
      //   LP o E1
      //    = Transpose(LP) * E
      //    = Transpose( T*LP ) * E
      //    = Transpose(LP) * Transpose(T) * E
      //    = Transpose(LP) * S * E
      //    = Transpose(LP) * (lambda E)
      //    = lambda * (Transpose(LP) * E )
      //    = lambda * LPoE
      //   If LPoE != 0, then lambda = 1, which is not the case.
      rc = bSmoothOrDartTwoFaceCase ? 0.0 : TestMatrixReturnValue(fabs(E1oLP) / lengthE1, rc);
      if (!(rc >= 0.0))
        break;
      rc = TestMatrixReturnValue(fabs(E2oLP) / lengthE2, rc);
      if (!(rc >= 0.0))
        break;

      // L1 and L2 should be orthogonal to (1,1,...,1) which means
      // L1 L2 coefficients should sum to zero.
      rc = TestMatrixReturnValue(fabs(L1sum) / lengthL1, rc);
      if (!(rc >= 0.0))
        break;
      rc = TestMatrixReturnValue(fabs(L2sum) / lengthL2, rc);
      if (!(rc >= 0.0))
        break;

      break;
    }

    // See if L1 and L2 can produce a reasonable normal in the simplest possible case
    double z = m_sector_type.SurfaceNormalSign();
    if (!(z > 0.0))
      return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  }

  if (rc >= 0.0)
    return rc;

  return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE); 
}